

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O0

void __thiscall RleTaskScheduler::run(RleTaskScheduler *this,uint i)

{
  bool bVar1;
  bool bVar2;
  ostream *this_00;
  FTOutline *this_01;
  char *__name;
  uint in_ESI;
  uint *in_RDI;
  uint n;
  bool success;
  VTask task;
  ostringstream nameStream;
  SW_FT_Stroker stroker;
  FTOutline outlineRef;
  FTOutline *in_stack_fffffffffffffda0;
  int local_258;
  shared_ptr<VRleTask> *in_stack_fffffffffffffdb0;
  TaskQueue<std::shared_ptr<VRleTask>_> *in_stack_fffffffffffffdb8;
  shared_ptr<VRleTask> *in_stack_fffffffffffffdc0;
  TaskQueue<std::shared_ptr<VRleTask>_> *in_stack_fffffffffffffdc8;
  VRleTask *in_stack_fffffffffffffdd0;
  ostringstream local_220 [532];
  uint local_c;
  
  local_c = in_ESI;
  FTOutline::FTOutline(in_stack_fffffffffffffda0);
  SW_FT_Stroker_New((SW_FT_Stroker *)in_stack_fffffffffffffda0);
  std::__cxx11::ostringstream::ostringstream(local_220);
  this_00 = std::operator<<((ostream *)local_220,"lottie-tsk-");
  std::ostream::operator<<(this_00,local_c);
  this_01 = (FTOutline *)pthread_self();
  std::__cxx11::ostringstream::str();
  __name = (char *)std::__cxx11::string::c_str();
  pthread_setname_np((pthread_t)this_01,__name);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
  std::shared_ptr<VRleTask>::shared_ptr((shared_ptr<VRleTask> *)0x13420a);
  do {
    bVar2 = false;
    for (local_258 = 0; local_258 != *in_RDI * 2; local_258 = local_258 + 1) {
      std::
      vector<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
      ::operator[]((vector<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
                    *)(in_RDI + 8),(ulong)(local_c + local_258) % (ulong)*in_RDI);
      bVar1 = TaskQueue<std::shared_ptr<VRleTask>_>::try_pop
                        (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      if (bVar1) {
        bVar2 = true;
        break;
      }
    }
    if (!bVar2) {
      std::
      vector<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
      ::operator[]((vector<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
                    *)(in_RDI + 8),(ulong)local_c);
      bVar2 = TaskQueue<std::shared_ptr<VRleTask>_>::pop
                        (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      if (!bVar2) {
        SW_FT_Stroker_Done((SW_FT_Stroker)0x1342d9);
        std::shared_ptr<VRleTask>::~shared_ptr((shared_ptr<VRleTask> *)0x1342e3);
        std::__cxx11::ostringstream::~ostringstream(local_220);
        FTOutline::~FTOutline(this_01);
        return;
      }
    }
    std::__shared_ptr_access<VRleTask,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<VRleTask,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this_01);
    VRleTask::operator()
              (in_stack_fffffffffffffdd0,(FTOutline *)in_stack_fffffffffffffdc8,
               (SW_FT_Stroker *)in_stack_fffffffffffffdc0);
  } while( true );
}

Assistant:

void run(unsigned i)
    {
        /*
         * initalize  per thread objects.
         */
        FTOutline     outlineRef;
        SW_FT_Stroker stroker;
        SW_FT_Stroker_New(&stroker);

        // Create Thread Name for Debugging (Linux)
#ifdef __linux__
        std::ostringstream nameStream;
        nameStream << "lottie-tsk-" << i;
        pthread_setname_np(pthread_self(), nameStream.str().c_str());
#endif

        // Task Loop
        VTask task;
        while (true) {
            bool success = false;

            for (unsigned n = 0; n != _count * 2; ++n) {
                if (_q[(i + n) % _count].try_pop(task)) {
                    success = true;
                    break;
                }
            }

            if (!success && !_q[i].pop(task)) break;

            (*task)(outlineRef, stroker);
        }

        // cleanup
        SW_FT_Stroker_Done(stroker);
    }